

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::PrintTupleTo<std::tuple<ot::commissioner::SecurityPolicy_const&>,1ul>
               (tuple<const_ot::commissioner::SecurityPolicy_&> *t,ostream *param_2)

{
  SecurityPolicy *value;
  ostream *os_local;
  tuple<const_ot::commissioner::SecurityPolicy_&> *t_local;
  
  PrintTupleTo<std::tuple<ot::commissioner::SecurityPolicy_const&>>(t,param_2);
  value = std::get<0ul,ot::commissioner::SecurityPolicy_const&>(t);
  UniversalPrinter<const_ot::commissioner::SecurityPolicy_&>::Print(value,param_2);
  return;
}

Assistant:

void PrintTupleTo(const T& t, std::integral_constant<size_t, I>,
                  ::std::ostream* os) {
  PrintTupleTo(t, std::integral_constant<size_t, I - 1>(), os);
  GTEST_INTENTIONAL_CONST_COND_PUSH_()
  if (I > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
    *os << ", ";
  }
  UniversalPrinter<typename std::tuple_element<I - 1, T>::type>::Print(
      std::get<I - 1>(t), os);
}